

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb_fastpforlib::internal::__fastpack18(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 & 0x3ffff;
  uVar2 = in[1];
  *out = uVar2 << 0x12 | uVar1 & 0x3ffff;
  out[1] = uVar2 >> 0xe & 0xf;
  Unroller<(unsigned_short)18,_(unsigned_short)2>::Pack(in,out + 1);
  return;
}

Assistant:

void __fastpack18(const uint32_t *__restrict in, uint32_t *__restrict out) {
	Unroller<18>::Pack(in, out);
}